

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O1

IdentifierSelectNameSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::IdentifierSelectNameSyntax,slang::parsing::Token,slang::syntax::SyntaxList<slang::syntax::ElementSelectSyntax>&>
          (BumpAllocator *this,Token *args,SyntaxList<slang::syntax::ElementSelectSyntax> *args_1)

{
  size_t sVar1;
  pointer ppEVar2;
  Info *pIVar3;
  SyntaxNode *pSVar4;
  TokenKind TVar5;
  undefined1 uVar6;
  NumericTokenFlags NVar7;
  uint32_t uVar8;
  undefined4 uVar9;
  IdentifierSelectNameSyntax *pIVar10;
  long lVar11;
  
  pIVar10 = (IdentifierSelectNameSyntax *)((ulong)(this->head->current + 7) & 0xfffffffffffffff8);
  if ((IdentifierSelectNameSyntax *)this->endPtr < pIVar10 + 1) {
    pIVar10 = (IdentifierSelectNameSyntax *)allocateSlow(this,0x60,8);
  }
  else {
    this->head->current = (byte *)(pIVar10 + 1);
  }
  TVar5 = args->kind;
  uVar6 = args->field_0x2;
  NVar7.raw = (args->numFlags).raw;
  uVar8 = args->rawLen;
  pIVar3 = args->info;
  (pIVar10->super_NameSyntax).super_ExpressionSyntax.super_SyntaxNode.kind = IdentifierSelectName;
  (pIVar10->super_NameSyntax).super_ExpressionSyntax.super_SyntaxNode.parent = (SyntaxNode *)0x0;
  (pIVar10->super_NameSyntax).super_ExpressionSyntax.super_SyntaxNode.previewNode =
       (SyntaxNode *)0x0;
  (pIVar10->identifier).kind = TVar5;
  (pIVar10->identifier).field_0x2 = uVar6;
  (pIVar10->identifier).numFlags = (NumericTokenFlags)NVar7.raw;
  (pIVar10->identifier).rawLen = uVar8;
  (pIVar10->identifier).info = pIVar3;
  uVar9 = *(undefined4 *)&(args_1->super_SyntaxListBase).super_SyntaxNode.field_0x4;
  pSVar4 = (args_1->super_SyntaxListBase).super_SyntaxNode.parent;
  (pIVar10->selectors).super_SyntaxListBase.super_SyntaxNode.kind =
       (args_1->super_SyntaxListBase).super_SyntaxNode.kind;
  *(undefined4 *)&(pIVar10->selectors).super_SyntaxListBase.super_SyntaxNode.field_0x4 = uVar9;
  (pIVar10->selectors).super_SyntaxListBase.super_SyntaxNode.parent = pSVar4;
  (pIVar10->selectors).super_SyntaxListBase.super_SyntaxNode.previewNode =
       (args_1->super_SyntaxListBase).super_SyntaxNode.previewNode;
  (pIVar10->selectors).super_SyntaxListBase._vptr_SyntaxListBase =
       (_func_int **)&PTR___cxa_pure_virtual_005b7e60;
  (pIVar10->selectors).super_SyntaxListBase.childCount = (args_1->super_SyntaxListBase).childCount;
  sVar1 = (args_1->super_span<slang::syntax::ElementSelectSyntax_*,_18446744073709551615UL>).
          _M_extent._M_extent_value;
  (pIVar10->selectors).super_span<slang::syntax::ElementSelectSyntax_*,_18446744073709551615UL>.
  _M_ptr = (args_1->super_span<slang::syntax::ElementSelectSyntax_*,_18446744073709551615UL>)._M_ptr
  ;
  (pIVar10->selectors).super_span<slang::syntax::ElementSelectSyntax_*,_18446744073709551615UL>.
  _M_extent._M_extent_value = sVar1;
  (pIVar10->selectors).super_SyntaxListBase._vptr_SyntaxListBase =
       (_func_int **)&PTR_getChild_005bb948;
  (pIVar10->selectors).super_SyntaxListBase.super_SyntaxNode.parent = (SyntaxNode *)pIVar10;
  sVar1 = (pIVar10->selectors).
          super_span<slang::syntax::ElementSelectSyntax_*,_18446744073709551615UL>._M_extent.
          _M_extent_value;
  if (sVar1 != 0) {
    ppEVar2 = (pIVar10->selectors).
              super_span<slang::syntax::ElementSelectSyntax_*,_18446744073709551615UL>._M_ptr;
    lVar11 = 0;
    do {
      *(IdentifierSelectNameSyntax **)(*(long *)((long)ppEVar2 + lVar11) + 8) = pIVar10;
      lVar11 = lVar11 + 8;
    } while (sVar1 << 3 != lVar11);
  }
  return pIVar10;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }